

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::SolveBeforeConstraintSyntax::SolveBeforeConstraintSyntax
          (SolveBeforeConstraintSyntax *this,Token solve,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *beforeExpr,Token before,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *afterExpr,Token semi)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  ExpressionSyntax *pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  size_t sVar8;
  
  uVar6 = before._0_8_;
  uVar5 = solve._0_8_;
  (this->super_ConstraintItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_ConstraintItemSyntax).super_SyntaxNode.kind = SolveBeforeConstraint;
  (this->solve).kind = (short)uVar5;
  (this->solve).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->solve).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->solve).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->solve).info = solve.info;
  SVar2 = (beforeExpr->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(beforeExpr->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->beforeExpr).super_SyntaxListBase.super_SyntaxNode.parent =
       (beforeExpr->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->beforeExpr).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->beforeExpr).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->beforeExpr).super_SyntaxListBase.childCount = (beforeExpr->super_SyntaxListBase).childCount
  ;
  (this->beforeExpr).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0050b090;
  sVar1 = (beforeExpr->elements).size_;
  (this->beforeExpr).elements.data_ = (beforeExpr->elements).data_;
  (this->beforeExpr).elements.size_ = sVar1;
  (this->before).kind = (short)uVar6;
  (this->before).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->before).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->before).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->before).info = before.info;
  SVar2 = (afterExpr->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(afterExpr->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->afterExpr).super_SyntaxListBase.super_SyntaxNode.parent =
       (afterExpr->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->afterExpr).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->afterExpr).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->afterExpr).super_SyntaxListBase.childCount = (afterExpr->super_SyntaxListBase).childCount;
  (this->afterExpr).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0050b090
  ;
  sVar1 = (afterExpr->elements).size_;
  (this->afterExpr).elements.data_ = (afterExpr->elements).data_;
  (this->afterExpr).elements.size_ = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->beforeExpr).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->beforeExpr).elements.size_ + 1;
  if (1 < uVar7) {
    sVar8 = 0;
    do {
      pEVar4 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator[]
                         (&this->beforeExpr,sVar8);
      (pEVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
      sVar8 = sVar8 + 1;
    } while (uVar7 >> 1 != sVar8);
  }
  (this->afterExpr).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->afterExpr).elements.size_ + 1;
  if (1 < uVar7) {
    sVar8 = 0;
    do {
      pEVar4 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator[]
                         (&this->afterExpr,sVar8);
      (pEVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
      sVar8 = sVar8 + 1;
    } while (uVar7 >> 1 != sVar8);
  }
  return;
}

Assistant:

SolveBeforeConstraintSyntax(Token solve, const SeparatedSyntaxList<ExpressionSyntax>& beforeExpr, Token before, const SeparatedSyntaxList<ExpressionSyntax>& afterExpr, Token semi) :
        ConstraintItemSyntax(SyntaxKind::SolveBeforeConstraint), solve(solve), beforeExpr(beforeExpr), before(before), afterExpr(afterExpr), semi(semi) {
        this->beforeExpr.parent = this;
        for (auto child : this->beforeExpr)
            child->parent = this;
        this->afterExpr.parent = this;
        for (auto child : this->afterExpr)
            child->parent = this;
    }